

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O2

void __thiscall
helics::udp::UdpServer::UdpServer
          (UdpServer *this,io_context *io_context,string_view interface,uint16_t portNum)

{
  socket *this_00;
  socklen_t __len;
  char *pcVar1;
  int __oflag;
  sockaddr *__addr;
  allocator<char> local_89;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  address local_58;
  endpoint local_3c;
  
  pcVar1 = interface._M_str;
  local_88._M_len = interface._M_len;
  (this->super_enable_shared_from_this<helics::udp::UdpServer>)._M_weak_this.
  super___weak_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<helics::udp::UdpServer>)._M_weak_this.
  super___weak_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->mSocket;
  local_88._M_str = pcVar1;
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>,io_context,0);
  __len = (socklen_t)pcVar1;
  (this->mRemoteEndpoint).impl_.data_.v6.sin6_scope_id = 0;
  *(undefined8 *)((long)&(this->mRemoteEndpoint).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->mRemoteEndpoint).impl_.data_ + 0x10) = 0;
  *(undefined8 *)&(this->mRemoteEndpoint).impl_.data_ = 2;
  memset(&this->mRecvBuffer,0,0x400);
  *(undefined8 *)&(this->mDataCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDataCall).super__Function_base._M_functor + 8) = 0;
  (this->mDataCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDataCall)._M_invoker = (_Invoker_type)0x0;
  local_78 = 2;
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(char *)&local_78,
             __oflag);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_78,&local_88,&local_89);
  ::asio::ip::make_address(&local_58,(char *)CONCAT44(uStack_74,local_78));
  ::asio::ip::detail::endpoint::endpoint(&local_3c,&local_58,portNum);
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(int)&local_3c,
             __addr,__len);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

UdpServer(asio::io_context& io_context, std::string_view interface, std::uint16_t portNum):
            mSocket(io_context)
        {
            mSocket.open(asio::ip::udp::v4());
            mSocket.bind(
                asio::ip::udp::endpoint(asio::ip::address::from_string(std::string(interface)),
                                        portNum));
        }